

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_write_client_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  size_t n;
  size_t i;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x9fd,"=> write client key exchange");
  if (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA) {
    ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)(pmStack_18->handshake->dhm_ctx).len;
    pmStack_18->out_msg[4] = (uchar)((ulong)ciphersuite_info >> 8);
    pmStack_18->out_msg[5] = (uchar)ciphersuite_info;
    n = 6;
    pmVar2 = pmStack_18->handshake;
    sVar4 = mbedtls_mpi_size(&(pmStack_18->handshake->dhm_ctx).P);
    i._4_4_ = mbedtls_dhm_make_public
                        (&pmVar2->dhm_ctx,(int)sVar4,pmStack_18->out_msg + n,
                         (size_t)ciphersuite_info,pmStack_18->conf->f_rng,pmStack_18->conf->p_rng);
    if (i._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa11,"mbedtls_dhm_make_public",i._4_4_);
      return i._4_4_;
    }
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa15,"DHM: X ",&(pmStack_18->handshake->dhm_ctx).X);
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa16,"DHM: GX",&(pmStack_18->handshake->dhm_ctx).GX);
    i._4_4_ = mbedtls_dhm_calc_secret
                        (&pmStack_18->handshake->dhm_ctx,pmStack_18->handshake->premaster,0x424,
                         &pmStack_18->handshake->pmslen,pmStack_18->conf->f_rng,
                         pmStack_18->conf->p_rng);
    if (i._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa1e,"mbedtls_dhm_calc_secret",i._4_4_);
      return i._4_4_;
    }
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa22,"DHM: K ",&(pmStack_18->handshake->dhm_ctx).K);
  }
  else if ((((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA) ||
            (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) ||
           (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA)) ||
          (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA)) {
    n = 4;
    i._4_4_ = mbedtls_ecdh_make_public
                        (&pmStack_18->handshake->ecdh_ctx,(size_t *)&ciphersuite_info,
                         pmStack_18->out_msg + 4,1000,pmStack_18->conf->f_rng,
                         pmStack_18->conf->p_rng);
    if (i._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa3a,"mbedtls_ecdh_make_public",i._4_4_);
      return i._4_4_;
    }
    mbedtls_debug_print_ecp
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa3e,"ECDH: Q",&(pmStack_18->handshake->ecdh_ctx).Q);
    i._4_4_ = mbedtls_ecdh_calc_secret
                        (&pmStack_18->handshake->ecdh_ctx,&pmStack_18->handshake->pmslen,
                         pmStack_18->handshake->premaster,0x400,pmStack_18->conf->f_rng,
                         pmStack_18->conf->p_rng);
    if (i._4_4_ != 0) {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa46,"mbedtls_ecdh_calc_secret",i._4_4_);
      return i._4_4_;
    }
    mbedtls_debug_print_mpi
              (pmStack_18,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa4a,"ECDH: z",&(pmStack_18->handshake->ecdh_ctx).z);
  }
  else {
    if (((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
        (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) ||
       ((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)))) {
      if ((pmStack_18->conf->psk == (uchar *)0x0) ||
         (pmStack_18->conf->psk_identity == (uchar *)0x0)) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xa5c,"got no private key for PSK");
        return -0x7600;
      }
      n = 4;
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)pmStack_18->conf->psk_identity_len;
      if ((undefined1 *)0x4000 < &ciphersuite_info->field_0x6) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xa66,"psk identity too long or SSL buffer too short");
        return -0x6a00;
      }
      pmStack_18->out_msg[4] = (uchar)((ulong)ciphersuite_info >> 8);
      n = 6;
      pmStack_18->out_msg[5] = (uchar)ciphersuite_info;
      memcpy(pmStack_18->out_msg + 6,pmStack_18->conf->psk_identity,
             pmStack_18->conf->psk_identity_len);
      n = pmStack_18->conf->psk_identity_len + n;
      if (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) {
        ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)0x0;
      }
      else if (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
        iVar3 = ssl_write_encrypted_pms(pmStack_18,n,(size_t *)&ciphersuite_info,2);
        if (iVar3 != 0) {
          return iVar3;
        }
        i._4_4_ = 0;
      }
      else if (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
        ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)(pmStack_18->handshake->dhm_ctx).len;
        if (0x4000 < (long)&ciphersuite_info->id + n + 2) {
          mbedtls_debug_print_msg
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xa8a,"psk identity or DHM size too long or SSL buffer too short");
          return -0x6a00;
        }
        lVar5 = n + 1;
        pmStack_18->out_msg[n] = (uchar)((ulong)ciphersuite_info >> 8);
        n = n + 2;
        pmStack_18->out_msg[lVar5] = (uchar)ciphersuite_info;
        pmVar2 = pmStack_18->handshake;
        sVar4 = mbedtls_mpi_size(&(pmStack_18->handshake->dhm_ctx).P);
        i._4_4_ = mbedtls_dhm_make_public
                            (&pmVar2->dhm_ctx,(int)sVar4,pmStack_18->out_msg + n,
                             (size_t)ciphersuite_info,pmStack_18->conf->f_rng,
                             pmStack_18->conf->p_rng);
        if (i._4_4_ != 0) {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xa97,"mbedtls_dhm_make_public",i._4_4_);
          return i._4_4_;
        }
        i._4_4_ = 0;
      }
      else {
        if (pmVar1->key_exchange != MBEDTLS_KEY_EXCHANGE_ECDHE_PSK) {
          mbedtls_debug_print_msg
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xab1,"should never happen");
          return -0x6c00;
        }
        i._4_4_ = mbedtls_ecdh_make_public
                            (&pmStack_18->handshake->ecdh_ctx,(size_t *)&ciphersuite_info,
                             pmStack_18->out_msg + n,0x4000 - n,pmStack_18->conf->f_rng,
                             pmStack_18->conf->p_rng);
        if (i._4_4_ != 0) {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0xaa8,"mbedtls_ecdh_make_public",i._4_4_);
          return i._4_4_;
        }
        mbedtls_debug_print_ecp
                  (pmStack_18,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xaac,"ECDH: Q",&(pmStack_18->handshake->ecdh_ctx).Q);
      }
      i._4_4_ = mbedtls_ssl_psk_derive_premaster(pmStack_18,pmVar1->key_exchange);
      if (i._4_4_ != 0) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xab8,"mbedtls_ssl_psk_derive_premaster",i._4_4_);
        return i._4_4_;
      }
    }
    else {
      if (pmVar1->key_exchange != MBEDTLS_KEY_EXCHANGE_RSA) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0xac9,"should never happen");
        return -0x6c00;
      }
      n = 4;
      iVar3 = ssl_write_encrypted_pms(pmStack_18,4,(size_t *)&ciphersuite_info,0);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    i._4_4_ = 0;
  }
  pmStack_18->out_msglen = (long)&ciphersuite_info->id + n;
  pmStack_18->out_msgtype = 0x16;
  *pmStack_18->out_msg = '\x10';
  pmStack_18->state = pmStack_18->state + 1;
  i._4_4_ = mbedtls_ssl_write_record(pmStack_18);
  if (i._4_4_ == 0) {
    mbedtls_debug_print_msg
              (pmStack_18,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xad9,"<= write client key exchange");
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_ret
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xad5,"mbedtls_ssl_write_record",i._4_4_);
    ssl_local._4_4_ = i._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_client_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write client key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA )
    {
        /*
         * DHM key exchange -- send G^X mod P
         */
        n = ssl->handshake->dhm_ctx.len;

        ssl->out_msg[4] = (unsigned char)( n >> 8 );
        ssl->out_msg[5] = (unsigned char)( n      );
        i = 6;

        ret = mbedtls_dhm_make_public( &ssl->handshake->dhm_ctx,
                                (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                               &ssl->out_msg[i], n,
                                ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_public", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );

        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      ssl->handshake->premaster,
                                      MBEDTLS_PREMASTER_SIZE,
                                     &ssl->handshake->pmslen,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) ||                      \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        /*
         * ECDH key exchange -- send client public value
         */
        i = 4;

        ret = mbedtls_ecdh_make_public( &ssl->handshake->ecdh_ctx,
                                &n,
                                &ssl->out_msg[i], 1000,
                                ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_public", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q", &ssl->handshake->ecdh_ctx.Q );

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx,
                                      &ssl->handshake->pmslen,
                                       ssl->handshake->premaster,
                                       MBEDTLS_MPI_MAX_SIZE,
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /*
         * opaque psk_identity<0..2^16-1>;
         */
        if( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key for PSK" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

        i = 4;
        n = ssl->conf->psk_identity_len;

        if( i + 2 + n > MBEDTLS_SSL_MAX_CONTENT_LEN )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "psk identity too long or "
                                        "SSL buffer too short" ) );
            return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
        }

        ssl->out_msg[i++] = (unsigned char)( n >> 8 );
        ssl->out_msg[i++] = (unsigned char)( n      );

        memcpy( ssl->out_msg + i, ssl->conf->psk_identity, ssl->conf->psk_identity_len );
        i += ssl->conf->psk_identity_len;

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK )
        {
            n = 0;
        }
        else
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            if( ( ret = ssl_write_encrypted_pms( ssl, i, &n, 2 ) ) != 0 )
                return( ret );
        }
        else
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
        {
            /*
             * ClientDiffieHellmanPublic public (DHM send G^X mod P)
             */
            n = ssl->handshake->dhm_ctx.len;

            if( i + 2 + n > MBEDTLS_SSL_MAX_CONTENT_LEN )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "psk identity or DHM size too long"
                                            " or SSL buffer too short" ) );
                return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
            }

            ssl->out_msg[i++] = (unsigned char)( n >> 8 );
            ssl->out_msg[i++] = (unsigned char)( n      );

            ret = mbedtls_dhm_make_public( &ssl->handshake->dhm_ctx,
                    (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                    &ssl->out_msg[i], n,
                    ssl->conf->f_rng, ssl->conf->p_rng );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_public", ret );
                return( ret );
            }
        }
        else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
        {
            /*
             * ClientECDiffieHellmanPublic public;
             */
            ret = mbedtls_ecdh_make_public( &ssl->handshake->ecdh_ctx, &n,
                    &ssl->out_msg[i], MBEDTLS_SSL_MAX_CONTENT_LEN - i,
                    ssl->conf->f_rng, ssl->conf->p_rng );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_public", ret );
                return( ret );
            }

            MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q", &ssl->handshake->ecdh_ctx.Q );
        }
        else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        i = 4;
        if( ( ret = ssl_write_encrypted_pms( ssl, i, &n, 0 ) ) != 0 )
            return( ret );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_ENABLED */
    {
        ((void) ciphersuite_info);
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    ssl->out_msglen  = i + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CLIENT_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write client key exchange" ) );

    return( 0 );
}